

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O3

void __thiscall QDateTimeEdit::setMaximumTime(QDateTimeEdit *this,QTime max)

{
  long lVar1;
  char cVar2;
  undefined8 uVar3;
  long in_FS_OFFSET;
  QDateTime local_30 [12];
  int local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QAbstractSpinBox).super_QWidget.field_0x8;
  local_24 = max.mds;
  cVar2 = QTime::isValid();
  if (cVar2 != '\0') {
    uVar3 = ::QVariant::toDate();
    QDateTime::QDateTime(local_30,uVar3,local_24,lVar1 + 0x508,1);
    setMaximumDateTime(this,local_30);
    QDateTime::~QDateTime(local_30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDateTimeEdit::setMaximumTime(QTime max)
{
    Q_D(QDateTimeEdit);
    if (max.isValid())
        setMaximumDateTime(d->dateTimeValue(d->maximum.toDate(), max));
}